

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall
AI::HierarchicalTaskNetworkComponent::recalculateLoci
          (HierarchicalTaskNetworkComponent *this,
          vector<int,_std::allocator<int>_> *updatedLociIndices)

{
  pointer pEVar1;
  long lVar2;
  pointer pFVar3;
  pointer pEVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  Vector3 local_b8;
  Vector3 local_ac;
  pointer local_a0;
  undefined1 local_98 [16];
  int *local_88;
  HierarchicalTaskNetworkComponent *local_80;
  int *local_78;
  pointer local_70;
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_78 = (updatedLociIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_88 = (updatedLociIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_78 != local_88) {
    local_80 = this;
    do {
      local_a0 = (local_80->state).memory.focusLocus.
                 super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
                 super__Vector_impl_data._M_start + *local_78;
      pEVar1 = *(pointer *)
                &(local_a0->engrams).super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
                 _M_impl;
      local_70 = *(pointer *)
                  ((long)&(local_a0->engrams).
                          super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl + 8);
      if (pEVar1 == local_70) {
        local_58 = 0.0;
        local_98 = ZEXT816(0);
        local_48 = 0.0;
        uVar7 = 0;
      }
      else {
        local_48 = 0.0;
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        iVar6 = 0;
        local_98 = ZEXT816(0);
        local_58 = 0.0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        lVar8 = 0;
        do {
          local_ac.x = (pEVar1->stimulus).x;
          local_ac.y = (pEVar1->stimulus).y;
          local_ac.z = 0.0;
          local_b8.x = *(float *)((long)&(pEVar1->stimulus).x + lVar8);
          local_b8.y = *(float *)((long)&(pEVar1->stimulus).y + lVar8);
          local_b8.z = 0.0;
          uStack_54 = uVar12;
          uStack_50 = uVar13;
          uStack_4c = uVar14;
          fVar9 = Math::distanceSquared(&local_ac,&local_b8);
          pFVar3 = local_a0;
          fVar11 = *(float *)((long)&(pEVar1->stimulus).intensity + lVar8);
          uVar12 = 0;
          uVar13 = 0;
          uVar14 = 0;
          if (lVar8 != 0) {
            lVar2 = *(long *)&(local_a0->engrams).
                              super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl;
            local_ac.x = *(float *)(lVar2 + lVar8);
            local_ac.y = *(float *)(lVar2 + 4 + lVar8);
            local_ac.z = 0.0;
            lVar2 = *(long *)&(local_a0->engrams).
                              super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl;
            local_b8.x = *(float *)(lVar2 + -0x30 + lVar8);
            local_b8.y = *(float *)(lVar2 + -0x2c + lVar8);
            local_b8.z = 0.0;
            local_68 = ZEXT416((uint)fVar11);
            fVar10 = Math::distanceSquared(&local_ac,&local_b8);
            lVar2 = *(long *)&(pFVar3->engrams).
                              super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl;
            fVar11 = (float)(*(int *)(lVar2 + -4 + lVar8) - *(int *)(lVar2 + 0x2c + lVar8));
            if (fVar11 <= 1.0) {
              fVar11 = 1.0;
            }
            local_98 = ZEXT416((uint)((float)local_98._0_4_ + fVar10 / fVar11));
            fVar11 = (float)local_68._0_4_;
            uVar12 = local_68._4_4_;
            uVar13 = local_68._8_4_;
            uVar14 = local_68._12_4_;
          }
          iVar6 = iVar6 + (uint)(10000.0 < fVar9);
          fVar9 = fVar11;
          if (fVar11 <= local_58) {
            fVar9 = local_58;
          }
          local_58 = (float)(~-(uint)NAN(local_58) & (uint)fVar9 |
                            -(uint)NAN(local_58) & (uint)fVar11);
          local_48 = local_48 + fVar11;
          pEVar4 = (pointer)((long)&pEVar1[1].stimulus.x + lVar8);
          lVar8 = lVar8 + 0x30;
        } while (pEVar4 != local_70);
        uVar7 = (ulong)(uint)(iVar6 * 2);
      }
      uVar5 = ((long)*(pointer *)
                      ((long)&(local_a0->engrams).
                              super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl +
                      8) -
               *(long *)&(local_a0->engrams).
                         super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl >> 4) *
              -0x5555555555555555;
      if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
        local_58 = (float)local_98._0_4_ / (float)(uVar5 - 1) + local_48 / (float)uVar5;
        local_a0->type = Path;
      }
      else {
        local_a0->field_1 = (anon_union_4_2_313644d9_for_FocusLocus_1)0x42c80000;
        local_a0->type = Area;
      }
      local_a0->currentImportance = local_58;
      local_78 = local_78 + 1;
    } while (local_78 != local_88);
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::recalculateLoci(std::vector<int> updatedLociIndices)
{
	const float maxDistanceToOrigin = 100.f * 100.f;
	
	for(auto id : updatedLociIndices)
	{
		//if all engrams are within a certain radius of the starting one, its an area loci
		//otherwise, its path
		auto& locus = state.memory.focusLocus[id];
		auto& origin = locus.engrams[0];
		unsigned int pastDistanceCount = 0;
		float maxDistance = maxDistanceToOrigin;
		float averageIntensity = 0.f;
		float maxIntensity = 0.f;
		float averageSpeed = 0.f;

		int i = 0;
		for (auto& engram : locus.engrams)
		{
			auto distance = distanceSquared({origin.stimulus.x, origin.stimulus.y, 0.f}, {engram.stimulus.x, engram.stimulus.y, 0.f});

			if (distance > maxDistanceToOrigin)
			{
				pastDistanceCount++;
			}

			maxDistance = fmax(maxDistance, distance);

			maxIntensity = fmax(maxIntensity, engram.stimulus.intensity);
			averageIntensity += engram.stimulus.intensity;

			if (i > 0)
			{
				auto speed = 
					distanceSquared(
						{locus.engrams[i].stimulus.x, locus.engrams[i].stimulus.y, 0.f},
						{locus.engrams[i - 1].stimulus.x, locus.engrams[i - 1].stimulus.y, 0.f})
					/ fmax(locus.engrams[i - 1].age - locus.engrams[i].age, 1);

				averageSpeed += speed;
			}

			i++;
		}

		averageIntensity /= locus.engrams.size();
		averageSpeed /= (locus.engrams.size() - 1);

		if (pastDistanceCount * 2u >= locus.engrams.size())
		{
			locus.type = FocusLocusType::Path;
			locus.currentImportance = averageIntensity + averageSpeed;
		}
		else
		{
			locus.type = FocusLocusType::Area;
			locus.area.radius = 100.f;
			locus.currentImportance = maxIntensity;
		}	
	}
}